

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O0

void __thiscall asl::IniFile::IniFile(IniFile *this,String *fname,bool shouldwrite)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  String *pSVar5;
  String *pSVar6;
  char *pcVar7;
  Map<asl::String,_asl::String> *this_00;
  String local_148;
  String local_130;
  int local_114;
  undefined1 local_110 [4];
  int i_1;
  String value;
  String key;
  int j;
  int i;
  String name;
  int end;
  int i0;
  String line;
  Map<asl::String,_asl::String> *local_88;
  Section *cursection;
  undefined1 local_78 [8];
  TextFile file;
  bool shouldwrite_local;
  String *fname_local;
  IniFile *this_local;
  
  Dic<asl::Dic<asl::String>_>::Dic(&this->_sections);
  asl::String::String(&this->_currentTitle);
  asl::String::String(&this->_filename);
  asl::String::String(&this->_indent);
  Array<asl::String>::Array(&this->_lines);
  this->_modified = false;
  asl::String::operator=(&this->_filename,fname);
  asl::String::operator=(&this->_currentTitle,"-");
  this->_ok = false;
  this->_shouldwrite = shouldwrite;
  TextFile::TextFile((TextFile *)local_78,fname,READ);
  bVar1 = File::operator!((File *)local_78);
  if (!bVar1) {
    Array<asl::String>::reserve(&this->_lines,0x10);
    this->_ok = true;
    asl::String::String((String *)((long)&line.field_2 + 8),"-");
    local_88 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                          ((Map<asl::String,_asl::Dic<asl::String>_> *)this,
                           (String *)((long)&line.field_2 + 8))->super_Map<asl::String,_asl::String>
    ;
    asl::String::~String((String *)((long)&line.field_2 + 8));
    do {
      bVar1 = TextFile::end((TextFile *)local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      TextFile::readLine((String *)&end,(TextFile *)local_78);
      if (shouldwrite) {
        Array<asl::String>::operator<<(&this->_lines,(String *)&end);
      }
      bVar1 = asl::String::ok((String *)&end);
      if (bVar1) {
        bVar1 = TextFile::end((TextFile *)local_78);
        if (bVar1) {
          cursection._4_4_ = 3;
        }
        else {
          name.field_2._12_4_ = 0;
          while( true ) {
            pcVar7 = asl::String::operator[]((String *)&end,name.field_2._12_4_);
            bVar2 = myisspace(*pcVar7);
            bVar1 = false;
            if (bVar2) {
              pcVar7 = asl::String::operator[]((String *)&end,name.field_2._12_4_);
              bVar1 = *pcVar7 != '\0';
            }
            if (!bVar1) break;
            name.field_2._12_4_ = name.field_2._12_4_ + 1;
          }
          pcVar7 = asl::String::operator[]((String *)&end,0);
          if (*pcVar7 == '[') {
            name.field_2._8_4_ = asl::String::indexOf((String *)&end,']',1);
            if ((int)name.field_2._8_4_ < 0) {
              cursection._4_4_ = 2;
              goto LAB_0015c1d8;
            }
            asl::String::substring((String *)&j,(String *)&end,1,name.field_2._8_4_);
            local_88 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                                  ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(String *)&j)->
                        super_Map<asl::String,_asl::String>;
            bVar1 = asl::String::operator==(&this->_currentTitle,"-");
            if (bVar1) {
              asl::String::operator=(&this->_currentTitle,(String *)&j);
            }
            asl::String::~String((String *)&j);
          }
          else {
            pcVar7 = asl::String::operator[]((String *)&end,name.field_2._12_4_);
            if (((*pcVar7 != '#') &&
                (pcVar7 = asl::String::operator[]((String *)&end,name.field_2._12_4_), '/' < *pcVar7
                )) && (pcVar7 = asl::String::operator[]((String *)&end,name.field_2._12_4_),
                      *pcVar7 != ';')) {
              iVar4 = asl::String::indexOf((String *)&end,'=',0);
              if (iVar4 < 1) {
                iVar4 = Array<asl::String>::length(&this->_lines);
                if (0 < iVar4) {
                  pSVar6 = Array<asl::String>::last(&this->_lines);
                  bVar1 = asl::String::ok(pSVar6);
                  if (bVar1) {
                    iVar4 = Array<asl::String>::length(&this->_lines);
                    Array<asl::String>::resize(&this->_lines,iVar4 + -1);
                  }
                }
                cursection._4_4_ = 2;
                goto LAB_0015c1d8;
              }
              bVar1 = asl::String::ok(&this->_indent);
              if (!bVar1) {
                for (key.field_2._8_4_ = 0; iVar3 = asl::String::length((String *)&end),
                    (int)key.field_2._8_4_ < iVar3; key.field_2._8_4_ = key.field_2._8_4_ + 1) {
                  pcVar7 = asl::String::operator[]((String *)&end,key.field_2._8_4_);
                  bVar1 = myisspace(*pcVar7);
                  if (!bVar1) break;
                  pcVar7 = asl::String::operator[]((String *)&end,key.field_2._8_4_);
                  asl::String::operator+=(&this->_indent,*pcVar7);
                }
              }
              asl::String::substring((String *)((long)&value.field_2 + 8),(String *)&end,0,iVar4);
              asl::String::substring((String *)local_110,(String *)&end,iVar4 + 1);
              pSVar6 = asl::String::trim((String *)local_110);
              pSVar5 = asl::String::trim((String *)((long)&value.field_2 + 8));
              pSVar5 = asl::String::replaceme(pSVar5,'/','\\');
              pSVar5 = Map<asl::String,_asl::String>::operator[](local_88,pSVar5);
              asl::String::operator=(pSVar5,pSVar6);
              asl::String::~String((String *)local_110);
              asl::String::~String((String *)((long)&value.field_2 + 8));
            }
          }
          cursection._4_4_ = 0;
        }
      }
      else {
        cursection._4_4_ = 2;
      }
LAB_0015c1d8:
      asl::String::~String((String *)&end);
    } while ((cursection._4_4_ == 0) || (cursection._4_4_ == 2));
    local_114 = Array<asl::String>::length(&this->_lines);
    while( true ) {
      local_114 = local_114 + -1;
      bVar1 = false;
      if (0 < local_114) {
        pSVar6 = Array<asl::String>::operator[](&this->_lines,local_114);
        pcVar7 = asl::String::operator[](pSVar6,0);
        bVar1 = *pcVar7 == '\0';
      }
      if (!bVar1) break;
      iVar4 = Array<asl::String>::length(&this->_lines);
      Array<asl::String>::resize(&this->_lines,iVar4 + -1);
    }
    asl::String::String(&local_130,"-");
    this_00 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                         ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_130)->
               super_Map<asl::String,_asl::String>;
    iVar4 = Map<asl::String,_asl::String>::length(this_00);
    asl::String::~String(&local_130);
    if (iVar4 == 0) {
      asl::String::String(&local_148,"-");
      Map<asl::String,_asl::Dic<asl::String>_>::remove
                ((Map<asl::String,_asl::Dic<asl::String>_> *)this,(char *)&local_148);
      asl::String::~String(&local_148);
    }
    else {
      asl::String::operator=(&this->_currentTitle,"-");
    }
  }
  TextFile::~TextFile((TextFile *)local_78);
  return;
}

Assistant:

IniFile::IniFile(const String& fname, bool shouldwrite)
{
	_modified = false;
	_filename = fname;
	_currentTitle = NOSECTION;
	_ok = false;
	_shouldwrite = shouldwrite;
	TextFile file(fname, File::READ);
	if(!file) {
		return;
	}
	_lines.reserve(16);
	_ok = true;
	Section* cursection = &_sections[NOSECTION];
	while(!file.end())
	{
		String line=file.readLine();
		if (shouldwrite)
			_lines << line;
		if(!line.ok())
			continue;
		if(file.end())
			break;

		int i0 = 0;
		while (myisspace(line[i0]) && line[i0] != '\0')
			i0++;

		if (line[0] == '[')
		{
			int end = line.indexOf(']', 1);
			if(end < 0)
				continue;
			String name = line.substring(1, end);
			cursection = &_sections[name];
			if (_currentTitle == NOSECTION)
				_currentTitle = name;
		}
		else if(line[i0] != '#' && line[i0] > 47 && line[i0] != ';')
		{
			int i = line.indexOf('=');
			if (i < 1)
			{
				if (_lines.length() > 0 && _lines.last().ok())
					_lines.resize(_lines.length() - 1);
				continue;
			}
			if (!_indent.ok())
				for (int j = 0; j < line.length(); j++)
				{
					if (myisspace(line[j]))
						_indent += line[j];
					else
						break;
				}
			String key = line.substring(0,i);
			String value = line.substring(i+1);
			(*cursection)[key.trim().replaceme('/', '\\')] = value.trim();
		}
	}
	
	for(int i=_lines.length()-1; i>0 && _lines[i][0] == '\0'; i--)
	{
		_lines.resize(_lines.length()-1);
	}
	if (_sections[NOSECTION].length() == 0)
		_sections.remove(NOSECTION);
	else
		_currentTitle = NOSECTION;
}